

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O0

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>
::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,_1,_0,__1,_1> *workspace)

{
  long lVar1;
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  bool bVar2;
  Index IVar3;
  Index IVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  EssentialVectorType local_368;
  Type local_330;
  EssentialVectorType local_2f8;
  Type local_2c0;
  long local_288;
  Index cornerSize_1;
  Index k_2;
  Type local_240;
  long local_1d8;
  Index k_1;
  Type local_198;
  EssentialVectorType local_130;
  Type local_f8;
  EssentialVectorType local_c0;
  Type local_88;
  long local_50;
  Index cornerSize;
  Index k;
  DiagonalReturnType local_38;
  long local_28;
  Index vecs;
  Matrix<double,__1,_1,_0,__1,_1> *workspace_local;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  *this_local;
  
  vecs = (Index)workspace;
  workspace_local = (Matrix<double,__1,_1,_0,__1,_1> *)dst;
  dst_local = (Matrix<double,__1,__1,_0,__1,__1> *)this;
  IVar3 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                  *)this);
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,IVar3);
  local_28 = *(long *)(this + 0x18);
  bVar2 = internal::
          is_same_dense<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)workspace_local,
                     *(Matrix<double,__1,__1,_0,__1,__1> **)this,(type *)0x0);
  this_00 = workspace_local;
  if (bVar2) {
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::diagonal
              (&local_38,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)workspace_local);
    DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>::setOnes
              ((DenseBase<Eigen::Diagonal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_> *)&local_38
              );
    k = (Index)MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::triangularView<10u>
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)workspace_local);
    TriangularViewImpl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U,_Eigen::Dense>::setZero
              ((TriangularViewImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U,_Eigen::Dense> *)&k
              );
    cornerSize = local_28;
    while (cornerSize = cornerSize + -1, -1 < cornerSize) {
      IVar3 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
              ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                      *)this);
      local_50 = (IVar3 - cornerSize) - *(long *)(this + 0x20);
      if (((byte)this[0x10] & 1) == 0) {
        DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                  (&local_f8,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)workspace_local,
                   local_50,local_50);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_130,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,cornerSize);
        pSVar5 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                           (*(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)(this + 8)
                            ,cornerSize);
        pSVar6 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                           ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vecs);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   &local_f8,&local_130,pSVar5,pSVar6);
      }
      else {
        DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                  (&local_88,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)workspace_local,
                   local_50,local_50);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_c0,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,cornerSize);
        pSVar5 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                           (*(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)(this + 8)
                            ,cornerSize);
        pSVar6 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                           ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vecs);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   &local_88,&local_c0,pSVar5,pSVar6);
      }
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                ((ColXpr *)&k_1,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)workspace_local,cornerSize)
      ;
      IVar3 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
              ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                      *)this);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_198,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &k_1,(IVar3 - cornerSize) + -1);
      DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
      ::setZero((DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                 *)&local_198);
    }
    for (local_1d8 = 0; lVar1 = local_1d8,
        IVar3 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
                ::cols((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                        *)this), lVar1 < IVar3 - local_28; local_1d8 = local_1d8 + 1) {
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                ((ColXpr *)&k_2,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)workspace_local,local_1d8);
      IVar3 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
              ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                      *)this);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_240,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &k_2,(IVar3 - local_1d8) + -1);
      DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
      ::setZero((DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                 *)&local_240);
    }
  }
  else if (*(long *)(this + 0x18) < 0x31) {
    IVar3 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
            ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                    *)this);
    IVar4 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
            ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                    *)this);
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,IVar3,IVar4);
    cornerSize_1 = local_28;
    while (cornerSize_1 = cornerSize_1 + -1, -1 < cornerSize_1) {
      IVar3 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
              ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                      *)this);
      local_288 = (IVar3 - cornerSize_1) - *(long *)(this + 0x20);
      if (((byte)this[0x10] & 1) == 0) {
        DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                  (&local_330,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)workspace_local,
                   local_288,local_288);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_368,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,cornerSize_1);
        pSVar5 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                           (*(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)(this + 8)
                            ,cornerSize_1);
        pSVar6 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                           ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vecs);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   &local_330,&local_368,pSVar5,pSVar6);
      }
      else {
        DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                  (&local_2c0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)workspace_local,
                   local_288,local_288);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_2f8,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,cornerSize_1);
        pSVar5 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                           (*(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)(this + 8)
                            ,cornerSize_1);
        pSVar6 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                           ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vecs);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   &local_2c0,&local_2f8,pSVar5,pSVar6);
      }
    }
  }
  else {
    IVar3 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
            ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                    *)this);
    IVar4 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
            ::rows((HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                    *)this);
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,IVar3,IVar4);
    if (((byte)this[0x10] & 1) == 0) {
      applyThisOnTheLeft<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (this,(Matrix<double,__1,__1,_0,__1,__1> *)workspace_local,
                 (Matrix<double,__1,_1,_0,__1,_1> *)vecs,true);
    }
    else {
      applyThisOnTheLeft<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (this,(Matrix<double,__1,__1,_0,__1,__1> *)workspace_local,
                 (Matrix<double,__1,_1,_0,__1,_1> *)vecs,true);
    }
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    void evalTo(Dest& dst, Workspace& workspace) const
    {
      workspace.resize(rows());
      Index vecs = m_length;
      if(internal::is_same_dense(dst,m_vectors))
      {
        // in-place
        dst.diagonal().setOnes();
        dst.template triangularView<StrictlyUpper>().setZero();
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_reverse)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), workspace.data());
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), workspace.data());

          // clear the off diagonal vector
          dst.col(k).tail(rows()-k-1).setZero();
        }
        // clear the remaining columns if needed
        for(Index k = 0; k<cols()-vecs ; ++k)
          dst.col(k).tail(rows()-k-1).setZero();
      }
      else if(m_length>BlockSize)
      {
        dst.setIdentity(rows(), rows());
        if(m_reverse)
          applyThisOnTheLeft(dst,workspace,true);
        else
          applyThisOnTheLeft(dst,workspace,true);
      }
      else
      {
        dst.setIdentity(rows(), rows());
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_reverse)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), workspace.data());
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), workspace.data());
        }
      }
    }